

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

int mjs::interpreter::impl::tri_compare(double l,double r)

{
  int iVar1;
  
  if (NAN(l) || NAN(r)) {
    return -1;
  }
  iVar1 = 0;
  if ((((l != r) || (NAN(l) || NAN(r))) && (l < INFINITY)) && (l != 0.0 || r != 0.0)) {
    if (INFINITY <= r) {
      return 1;
    }
    if ((-INFINITY < r) && (iVar1 = 1, -INFINITY < l)) {
      return (int)(l < r);
    }
  }
  return iVar1;
}

Assistant:

static int tri_compare(double l, double r) {
        if (std::isnan(l) || std::isnan(r)) {
            return -1;
        }
        if (l == r || (l == 0.0 && r == 0.0))  {
            return 0;
        }
        if (l == +INFINITY) {
            return 0;
        } else if (r == +INFINITY) {
            return 1;
        } else if (r == -INFINITY) {
            return 0;
        } else if (l == -INFINITY) {
            return 1;
        }
        return l < r;
    }